

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

int spill_el_cmp(spill_el_t *e1,spill_el_t *e2)

{
  int local_28;
  int local_24;
  spill_el_t *e2_local;
  spill_el_t *e1_local;
  
  if (e1->edge_p == e2->edge_p) {
    if ((e1->edge_p == '\0') || ((e1->u).e == (e2->u).e)) {
      if ((e1->edge_p == '\0') && ((e1->u).e != (e2->u).e)) {
        e1_local._4_4_ = 1;
        if (((e1->u).e)->src < ((e2->u).e)->src) {
          e1_local._4_4_ = -1;
        }
      }
      else if ((e1->edge_p == '\0') && (e1->bb_end_p != e2->bb_end_p)) {
        e1_local._4_4_ = (int)e1->bb_end_p - (int)e2->bb_end_p;
      }
      else if (e1->spill_p == e2->spill_p) {
        if (e1->reg == e2->reg) {
          local_28 = 0;
        }
        else {
          local_28 = 1;
          if (e1->reg < e2->reg) {
            local_28 = -1;
          }
        }
        e1_local._4_4_ = local_28;
      }
      else {
        if ((e1->edge_p == '\0') && (e1->bb_end_p == '\0')) {
          local_24 = (int)e1->spill_p - (int)e2->spill_p;
        }
        else {
          local_24 = (int)e2->spill_p - (int)e1->spill_p;
        }
        e1_local._4_4_ = local_24;
      }
    }
    else {
      e1_local._4_4_ = 1;
      if ((e1->u).e < (e2->u).e) {
        e1_local._4_4_ = -1;
      }
    }
  }
  else {
    e1_local._4_4_ = (int)e1->edge_p - (int)e2->edge_p;
  }
  return e1_local._4_4_;
}

Assistant:

static int spill_el_cmp (const spill_el_t *e1, const spill_el_t *e2) {
  if (e1->edge_p != e2->edge_p) return e1->edge_p - e2->edge_p; /* put bb first */
  if (e1->edge_p && e1->u.e != e2->u.e) return e1->u.e < e2->u.e ? -1 : 1;
  if (!e1->edge_p && e1->u.bb != e2->u.bb) return e1->u.bb->index < e2->u.bb->index ? -1 : 1;
  if (!e1->edge_p && e1->bb_end_p != e2->bb_end_p)
    return e1->bb_end_p - e2->bb_end_p; /* start first */
  if (e1->spill_p != e2->spill_p)       /* load first for bb start, store first otherwise: */
    return !e1->edge_p && !e1->bb_end_p ? e1->spill_p - e2->spill_p : e2->spill_p - e1->spill_p;
  return e1->reg == e2->reg ? 0 : e1->reg < e2->reg ? -1 : 1; /* smaller reg first */
}